

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O2

deBool deSocket_connect(deSocket *sock,deSocketAddress *address)

{
  deBool dVar1;
  int iVar2;
  int iVar3;
  NativeSocklen *in_RCX;
  int __protocol;
  NativeSocklen bsdAddrLen;
  deUint8 bsdAddrBuf [28];
  
  dVar1 = deSocketAddressToBsdAddress(address,(size_t)bsdAddrBuf,(sockaddr *)&bsdAddrLen,in_RCX);
  if (dVar1 == 0) {
    dVar1 = 0;
  }
  else {
    iVar3 = (uint)(address->type == DE_SOCKETTYPE_DATAGRAM) * 2;
    if (address->type == DE_SOCKETTYPE_STREAM) {
      iVar3 = 1;
    }
    iVar2 = 0x11;
    if (address->protocol != DE_SOCKETPROTOCOL_UDP) {
      iVar2 = 0;
    }
    __protocol = 6;
    if (address->protocol != DE_SOCKETPROTOCOL_TCP) {
      __protocol = iVar2;
    }
    iVar3 = socket((uint)(ushort)bsdAddrBuf._0_2_,iVar3,__protocol);
    sock->handle = iVar3;
    dVar1 = 0;
    if (iVar3 != -1) {
      iVar3 = connect(iVar3,(sockaddr *)bsdAddrBuf,bsdAddrLen);
      if (iVar3 == 0) {
        sock->state = DE_SOCKETSTATE_CONNECTED;
        sock->openChannels = 3;
        dVar1 = 1;
      }
      else {
        close(sock->handle);
        sock->handle = -1;
      }
    }
  }
  return dVar1;
}

Assistant:

deBool deSocket_connect (deSocket* sock, const deSocketAddress* address)
{
	deUint8				bsdAddrBuf[sizeof(struct sockaddr_in6)];
	struct sockaddr*	bsdAddr		= (struct sockaddr*)&bsdAddrBuf[0];
	NativeSocklen		bsdAddrLen;

	/* Resolve address. */
	if (!deSocketAddressToBsdAddress(address, sizeof(bsdAddrBuf), bsdAddr, &bsdAddrLen))
		return DE_FALSE;

	/* Create socket. */
	sock->handle = socket(bsdAddr->sa_family, deSocketTypeToBsdType(address->type), deSocketProtocolToBsdProtocol(address->protocol));
	if (!deSocketHandleIsValid(sock->handle))
		return DE_FALSE;

	/* Connect. */
	if (connect(sock->handle, bsdAddr, bsdAddrLen) != 0)
	{
#if defined(DE_USE_WINSOCK)
		closesocket(sock->handle);
#else
		close(sock->handle);
#endif
		sock->handle = DE_INVALID_SOCKET_HANDLE;
		return DE_FALSE;
	}

	sock->state			= DE_SOCKETSTATE_CONNECTED;
	sock->openChannels	= DE_SOCKETCHANNEL_BOTH;

	return DE_TRUE;
}